

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Fodder * __thiscall
jsonnet::internal::FixNewlines::argParamOpenFodder(FixNewlines *this,ArgParam *param)

{
  AST *pAVar1;
  ostream *poVar2;
  
  if (param->id == (Identifier *)0x0) {
    if (param->expr == (AST *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Invalid ArgParam");
      std::endl<char,std::char_traits<char>>(poVar2);
      abort();
    }
    pAVar1 = left_recursive_deep(param->expr);
    param = (ArgParam *)&pAVar1->openFodder;
  }
  return &param->idFodder;
}

Assistant:

Fodder &argParamOpenFodder(ArgParam &param)
    {
        if (param.id != nullptr) {
            return param.idFodder;
        } else if (param.expr != nullptr) {
            return open_fodder(param.expr);
        } else {
            std::cerr << "Invalid ArgParam" << std::endl;
            abort();
        }
    }